

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_sync_backward(pt_event_decoder *decoder)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int errcode;
  uint8_t *pos;
  uint8_t *sync;
  uint8_t *start;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -2;
  }
  else {
    sync = pt_evt_pos(decoder);
    if ((sync == (uint8_t *)0x0) && (sync = pt_evt_end(decoder), sync == (uint8_t *)0x0)) {
      decoder_local._4_4_ = -10;
    }
    else {
      pos = sync;
      while (decoder_local._4_4_ = pt_evt_reset(decoder), -1 < decoder_local._4_4_) {
        do {
          iVar1 = pt_pkt_sync_backward(&decoder->pacdec);
          if (iVar1 < 0) {
            return iVar1;
          }
          puVar2 = pt_evt_pos(decoder);
        } while (pos <= puVar2);
        iVar1 = pt_evt_start(decoder);
        puVar3 = pt_evt_pos(decoder);
        pos = puVar2;
        if (puVar3 < sync) {
          return iVar1;
        }
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_evt_sync_backward(struct pt_event_decoder *decoder)
{
	const uint8_t *start, *sync, *pos;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	start = pt_evt_pos(decoder);
	if (!start) {
		start = pt_evt_end(decoder);
		if (!start)
			return -pte_bad_config;
	}

	sync = start;
	for (;;) {
		errcode = pt_evt_reset(decoder);
		if (errcode < 0)
			return errcode;

		do {
			errcode = pt_pkt_sync_backward(&decoder->pacdec);
			if (errcode < 0)
				return errcode;

			pos = pt_evt_pos(decoder);
		} while (sync <= pos);

		sync = pos;

		errcode = pt_evt_start(decoder);

		pos = pt_evt_pos(decoder);
		if (pos < start)
			return errcode;
	}
}